

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::kotlin::FieldGenerator::GenerateStringField
          (FieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  long lVar3;
  string_view text;
  string_view text_00;
  allocator<char> local_30a;
  allocator<char> local_309;
  undefined1 *local_308;
  undefined8 local_300;
  undefined1 local_2f8 [8];
  undefined8 uStack_2f0;
  undefined1 *local_2e8;
  undefined8 local_2e0;
  undefined1 local_2d8 [8];
  undefined8 uStack_2d0;
  JvmNameContext name_ctx;
  _Any_data local_2b0;
  code *local_2a0;
  code *local_298;
  undefined1 local_290 [64];
  char local_250;
  undefined1 *local_248;
  undefined8 local_240;
  undefined1 local_238 [16];
  undefined1 local_228;
  undefined1 local_1e0;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8 [8];
  undefined8 uStack_1c0;
  variant<std::__cxx11::string,std::function<bool()>> local_1b8 [32];
  char local_198;
  undefined1 *local_190;
  undefined8 local_188;
  undefined1 local_180 [16];
  undefined1 local_170;
  undefined1 local_128;
  Options local_120;
  Options local_d0;
  Options local_80;
  
  bVar2 = FieldDescriptor::is_repeated(this->descriptor_);
  if (bVar2) {
    GenerateRepeatedStringField(this,printer);
    return;
  }
  name_ctx.options = &this->context_->options_;
  name_ctx.lite = this->lite_;
  pFVar1 = this->descriptor_;
  name_ctx.printer = printer;
  java::Options::Options(&local_80,name_ctx.options);
  java::WriteFieldDocComment(printer,pFVar1,&local_80,true);
  java::Options::~Options(&local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"jvm_name_get",&local_309)
  ;
  local_290._0_8_ = local_290 + 0x10;
  if (local_2e8 == local_2d8) {
    local_290._24_8_ = uStack_2d0;
  }
  else {
    local_290._0_8_ = local_2e8;
  }
  local_290._8_8_ = local_2e0;
  local_2e0 = 0;
  local_2b0._8_8_ = 0;
  local_2d8[0] = 0;
  local_298 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_2a0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_2e8 = local_2d8;
  local_2b0._M_unused._M_object = &name_ctx;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_290 + 0x20),
             (function<bool_()> *)&local_2b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_2b0);
  local_248 = local_238;
  local_240 = 0;
  local_238[0] = 0;
  local_228 = 0;
  if (local_250 == '\x01') {
    std::__cxx11::string::assign((char *)&local_248);
  }
  local_1e0 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"jvm_name_set",&local_30a)
  ;
  local_1d0 = local_300;
  local_1d8 = local_1c8;
  if (local_308 == local_2f8) {
    uStack_1c0 = uStack_2f0;
  }
  else {
    local_1d8 = local_308;
  }
  local_300 = 0;
  local_2f8[0] = 0;
  local_2b0._8_8_ = 0;
  local_298 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_2a0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_308 = local_2f8;
  local_2b0._M_unused._M_object = &name_ctx;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_1b8,(function<bool_()> *)&local_2b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_2b0);
  local_190 = local_180;
  local_188 = 0;
  local_180[0] = 0;
  local_170 = 0;
  if (local_198 == '\x01') {
    std::__cxx11::string::assign((char *)&local_190);
  }
  local_128 = 0;
  io::Printer::Emit(printer,local_290,2,0xc9);
  lVar3 = 0xb8;
  do {
    io::Printer::Sub::~Sub((Sub *)(local_290 + lVar3));
    lVar3 = lVar3 + -0xb8;
  } while (lVar3 != -0xb8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  pFVar1 = this->descriptor_;
  java::Options::Options(&local_d0,&this->context_->options_);
  java::WriteFieldAccessorDocComment(printer,pFVar1,CLEARER,&local_d0,false,true,false);
  java::Options::~Options(&local_d0);
  text._M_str = 
  "public fun ${$clear$kt_capitalized_name$$}$() {\n  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n}\n"
  ;
  text._M_len = 0x65;
  io::Printer::Print<>(printer,text);
  bVar2 = FieldDescriptor::has_presence(this->descriptor_);
  if (bVar2) {
    pFVar1 = this->descriptor_;
    java::Options::Options(&local_120,&this->context_->options_);
    java::WriteFieldAccessorDocComment(printer,pFVar1,HAZZER,&local_120,false,true,false);
    java::Options::~Options(&local_120);
    text_00._M_str =
         "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n}\n"
    ;
    text_00._M_len = 0x78;
    io::Printer::Print<>(printer,text_00);
  }
  return;
}

Assistant:

void FieldGenerator::GenerateStringField(io::Printer* printer) const {
  if (descriptor_->is_repeated()) {
    GenerateRepeatedStringField(printer);
    return;
  }
  java::JvmNameContext name_ctx = {context_->options(), printer, lite_};
  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name_get",
           [&] { JvmName("${$get$kt_capitalized_name$$}$", name_ctx); }},
          {"jvm_name_set",
           [&] { JvmName("${$set$kt_capitalized_name$$}$", name_ctx); }},
      },
      "$kt_deprecation$public var $kt_name$: kotlin.String\n"
      "  $jvm_name_get$"
      "  get() = $kt_dsl_builder$.${$$kt_safe_name$$}$\n"
      "  $jvm_name_set$"
      "  set(value) {\n"
      "    $kt_dsl_builder$.${$$kt_safe_name$$}$ = value\n"
      "  }\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::CLEARER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Print(
      "public fun ${$clear$kt_capitalized_name$$}$() {\n"
      "  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n"
      "}\n");

  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, java::HAZZER,
                                 context_->options(), /* builder */ false,
                                 /* kdoc */ true);
    printer->Print(
        "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n"
        "  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n"
        "}\n");
  }
}